

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_EditionDefaultsInvalidMinimumTwice_Test::TestBody
          (CommandLineInterfaceTest_EditionDefaultsInvalidMinimumTwice_Test *this)

{
  Metadata MVar1;
  string_view name;
  string_view expected_substring;
  string_view contents;
  string local_58;
  string local_38;
  
  MVar1 = DescriptorProto::GetMetadata((DescriptorProto *)_DescriptorProto_default_instance_);
  FileDescriptor::DebugString_abi_cxx11_(&local_38,(MVar1.descriptor)->file_);
  name._M_str = "google/protobuf/descriptor.proto";
  name._M_len = 0x20;
  contents._M_str = local_38._M_dataplus._M_p;
  contents._M_len = local_38._M_string_length;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,
             "protocol_compiler --proto_path=$tmpdir --edition_defaults_minimum=2023 --edition_defaults_minimum=2023 google/protobuf/descriptor.proto"
             ,"");
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  expected_substring._M_str = "edition_defaults_minimum may only be passed once";
  expected_substring._M_len = 0x30;
  CommandLineInterfaceTester::ExpectErrorSubstring
            ((CommandLineInterfaceTester *)this,expected_substring);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, EditionDefaultsInvalidMinimumTwice) {
  CreateTempFile("google/protobuf/descriptor.proto",
                 google::protobuf::DescriptorProto::descriptor()->file()->DebugString());
  Run("protocol_compiler --proto_path=$tmpdir "
      "--edition_defaults_minimum=2023 "
      "--edition_defaults_minimum=2023 "
      "google/protobuf/descriptor.proto");
  ExpectErrorSubstring("edition_defaults_minimum may only be passed once");
}